

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

Drop * __thiscall wasm::Builder::makeDrop(Builder *this,Expression *value)

{
  Drop *pDVar1;
  
  pDVar1 = (Drop *)MixedArena::allocSpace((MixedArena *)(this->wasm + 0x200),0x18,8);
  (pDVar1->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
  (pDVar1->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
  pDVar1->value = value;
  wasm::Drop::finalize();
  return pDVar1;
}

Assistant:

Drop* makeDrop(Expression* value) {
    auto* ret = wasm.allocator.alloc<Drop>();
    ret->value = value;
    ret->finalize();
    return ret;
  }